

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

void __thiscall
HighsCliqueTable::extractObjCliques(HighsCliqueTable *this,HighsMipSolver *mipsolver)

{
  double *pdVar1;
  double dVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  anon_class_16_2_cb98ba35 __pred;
  anon_class_24_3_d65a4cbc __pred_00;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  pointer pHVar7;
  iterator iVar8;
  difference_type dVar9;
  reference pvVar10;
  reference piVar11;
  size_type sVar12;
  double *in_RSI;
  double dVar13;
  double dVar14;
  HighsCDouble HVar15;
  HighsInt pos;
  iterator j;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> cliqueend;
  double mincliqueval;
  HighsInt k;
  double feastol;
  HighsInt ninf;
  HighsCDouble minact;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> clique;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> binaryend;
  vector<int,_std::allocator<int>_> perm;
  double rhs;
  HighsInt len;
  HighsInt *inds;
  double *vals;
  HighsDomain *globaldom;
  HighsInt nbin;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffcf8;
  vector<int,_std::allocator<int>_> *pvVar16;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd00;
  HighsDomain *this_00;
  HighsInt *in_stack_fffffffffffffd08;
  HighsCDouble *b;
  anon_class_8_1_8992ca70 in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd20;
  double *in_stack_fffffffffffffd28;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  HighsInt **in_stack_fffffffffffffd70;
  double *in_stack_fffffffffffffd78;
  HighsInt *in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffd88;
  HighsDomain *in_stack_fffffffffffffd90;
  HighsCDouble *in_stack_fffffffffffffda0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1a8;
  int *local_1a0;
  undefined1 *local_198;
  double *local_190;
  int *local_188;
  int *local_180;
  int *local_178;
  int *local_170;
  HighsCDouble local_168;
  HighsCDouble local_158;
  HighsCDouble local_148;
  double local_138;
  int local_12c;
  HighsCDouble local_128;
  HighsCDouble local_118;
  double local_108;
  vector<int,_std::allocator<int>_> local_f8;
  int *local_e0;
  int *local_d8;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> local_d0;
  undefined4 local_b4;
  int *local_b0;
  vector<int,_std::allocator<int>_> *local_a8;
  HighsDomain *pHStack_a0;
  HighsCDouble *local_98;
  int *local_90;
  int *local_88;
  int *local_80;
  int *local_78;
  undefined1 in_stack_ffffffffffffff9b;
  HighsInt in_stack_ffffffffffffff9c;
  CliqueVar *in_stack_ffffffffffffffa0;
  HighsMipSolver *in_stack_ffffffffffffffa8;
  HighsCliqueTable *in_stack_ffffffffffffffb0;
  undefined1 local_30 [16];
  HighsDomain *local_20;
  HighsInt local_14;
  double *local_10;
  
  local_10 = in_RSI;
  pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x5396db);
  local_14 = HighsObjectiveFunction::getNumBinariesInObjective(&pHVar7->objectiveFunction);
  if (1 < local_14) {
    pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x539714);
    local_20 = &pHVar7->domain;
    dVar13 = HighsDomain::getObjectiveLowerBound
                       ((HighsDomain *)in_stack_fffffffffffffcf8._M_current);
    if ((dVar13 != -INFINITY) || (NAN(dVar13))) {
      HighsDomain::getCutoffConstraint
                ((HighsDomain *)in_stack_fffffffffffffd20._M_current,
                 (double **)CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
                 (HighsInt **)in_stack_fffffffffffffd10.vals,in_stack_fffffffffffffd08,
                 (double *)in_stack_fffffffffffffd00._M_current);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x539786);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd20._M_current,
                 CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
      iVar8 = std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffcf8._M_current);
      local_78 = (int *)std::vector<int,_std::allocator<int>_>::end
                                  (in_stack_fffffffffffffcf8._M_current);
      std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,0);
      local_88 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                  (in_stack_fffffffffffffcf8._M_current);
      local_90 = (int *)std::vector<int,_std::allocator<int>_>::end
                                  (in_stack_fffffffffffffcf8._M_current);
      pvVar16 = (vector<int,_std::allocator<int>_> *)(local_30 + 8);
      pHStack_a0 = local_20;
      b = (HighsCDouble *)local_30;
      __pred_00.globaldom = (HighsDomain *)in_stack_fffffffffffffd68;
      __pred_00.vals = (double **)in_stack_fffffffffffffd60;
      __pred_00.inds = in_stack_fffffffffffffd70;
      this_00 = local_20;
      local_a8 = pvVar16;
      local_98 = b;
      local_80 = (int *)std::
                        partition<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractObjCliques(HighsMipSolver&)::__0>
                                  (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,__pred_00);
      local_b0 = (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar16);
      dVar9 = __gnu_cxx::operator-
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         this_00,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)pvVar16);
      local_14 = (HighsInt)dVar9;
      if (local_14 < 2) {
        local_b4 = 1;
      }
      else {
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        vector((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
               0x53990c);
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        reserve((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *
                )in_stack_fffffffffffffd30._M_current,(size_type)in_stack_fffffffffffffd28);
        local_d8 = (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar16);
        local_e0 = local_80;
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)(local_30 + 8);
        end._M_current._7_1_ = in_stack_fffffffffffffd1f;
        end._M_current._0_7_ = in_stack_fffffffffffffd18;
        pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractObjCliques(HighsMipSolver&)::__1>
                  (in_stack_fffffffffffffd20,end,in_stack_fffffffffffffd10);
        pvVar16 = &local_f8;
        HighsDomain::computeMinActivity
                  (in_stack_fffffffffffffd90,(HighsInt)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                   (HighsInt)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                   in_stack_fffffffffffffd78,(HighsInt *)in_stack_fffffffffffffd70,
                   in_stack_fffffffffffffda0);
        pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x5399c9);
        uVar4 = local_30._8_8_;
        local_108 = pHVar7->feastol;
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffa8,0);
        uVar5 = local_30._8_8_;
        dVar13 = *(double *)(uVar4 + (long)*pvVar10 * 8);
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffa8,1);
        dVar2 = *(double *)(uVar5 + (long)*pvVar10 * 8);
        local_128 = ::operator-((double)in_stack_fffffffffffffd10.vals,b);
        local_118 = HighsCDouble::operator+((HighsCDouble *)this_00,(double)pvVar16);
        dVar14 = HighsCDouble::operator_cast_to_double(&local_118);
        iVar3 = local_14;
        if (dVar14 < ABS(dVar13) + ABS(dVar2)) {
          do {
            do {
              local_12c = iVar3 + -1;
              if (local_12c == 0) {
                local_b4 = 0;
                goto LAB_0053a0a1;
              }
              HVar15 = ::operator-((double)in_stack_fffffffffffffd10.vals,b);
              local_168 = HVar15;
              std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffa8,
                         (long)local_12c);
              HVar15 = HighsCDouble::operator-((HighsCDouble *)this_00,(double)pvVar16);
              local_158 = HVar15;
              HVar15 = HighsCDouble::operator+((HighsCDouble *)this_00,(double)pvVar16);
              local_148 = HVar15;
              local_138 = HighsCDouble::operator_cast_to_double(&local_148);
              local_178 = (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar16);
              local_188 = (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar16);
              local_180 = (int *)__gnu_cxx::
                                 __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                                 operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                            *)b,(difference_type)this_00);
              local_198 = local_30 + 8;
              local_190 = &local_138;
              __pred.mincliqueval = in_stack_fffffffffffffd28;
              __pred.vals = (double **)in_stack_fffffffffffffd20._M_current;
              local_170 = (int *)std::
                                 partition_point<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCliqueTable::extractObjCliques(HighsMipSolver&)::__2>
                                           (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                                            __pred);
              local_1a0 = (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar16);
              bVar6 = __gnu_cxx::operator==
                                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)this_00,
                                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)pvVar16);
              iVar3 = local_12c;
            } while (bVar6);
            std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
            clear((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   *)0x539dcb);
            local_1a8._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar16);
            while( true ) {
              bVar6 = __gnu_cxx::operator!=
                                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)this_00,
                                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)pvVar16);
              if (!bVar6) break;
              piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator*(&local_1a8);
              pdVar1 = (double *)(local_30._8_8_ + (long)*piVar11 * 8);
              if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
                std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                ::emplace_back<int_const&,int>
                          ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            *)in_stack_fffffffffffffd10.vals,(int *)b,(int *)this_00);
              }
              else {
                std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                ::emplace_back<int_const&,int>
                          ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            *)in_stack_fffffffffffffd10.vals,(int *)b,(int *)this_00);
              }
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&local_1a8);
            }
            dVar13 = (double)local_30._8_8_;
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffa8,
                                 (long)local_12c);
            pdVar1 = (double *)((long)dVar13 + (long)*pvVar10 * 8);
            if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
              in_stack_fffffffffffffd38._M_current = (int *)local_30._0_8_;
              std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffa8,
                         (long)local_12c);
              std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
              emplace_back<int_const&,int>
                        ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          *)in_stack_fffffffffffffd10.vals,(int *)b,(int *)this_00);
            }
            else {
              std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffa8,
                         (long)local_12c);
              std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
              emplace_back<int_const&,int>
                        ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          *)in_stack_fffffffffffffd10.vals,(int *)b,(int *)this_00);
            }
            sVar12 = std::
                     vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ::size(&local_d0);
            if (1 < sVar12) {
              in_stack_fffffffffffffd20._M_current = (int *)&local_d0;
              in_stack_fffffffffffffd28 = local_10;
              in_stack_fffffffffffffd30._M_current =
                   (int *)std::
                          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ::data((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                                  *)0x539fc5);
              std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ::size((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      *)in_stack_fffffffffffffd20._M_current);
              addClique(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                        in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                        (bool)in_stack_ffffffffffffff9b,(HighsInt)((ulong)iVar8._M_current >> 0x20))
              ;
              bVar6 = HighsDomain::infeasible(local_20);
              if (bVar6) {
                local_b4 = 1;
                goto LAB_0053a0a1;
              }
            }
            std::vector<int,_std::allocator<int>_>::begin(pvVar16);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)b,
                       (difference_type)this_00);
            bVar6 = __gnu_cxx::operator==
                              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               this_00,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                        *)pvVar16);
            iVar3 = local_12c;
          } while (!bVar6);
          local_b4 = 1;
        }
        else {
          local_b4 = 1;
        }
LAB_0053a0a1:
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        ~vector((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *
                )in_stack_fffffffffffffd10.vals);
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd10.vals);
    }
  }
  return;
}

Assistant:

void HighsCliqueTable::extractObjCliques(HighsMipSolver& mipsolver) {
  HighsInt nbin =
      mipsolver.mipdata_->objectiveFunction.getNumBinariesInObjective();
  if (nbin <= 1) return;
  HighsDomain& globaldom = mipsolver.mipdata_->domain;
  if (globaldom.getObjectiveLowerBound() == -kHighsInf) return;

  const double* vals;
  const HighsInt* inds;
  HighsInt len;
  double rhs;
  globaldom.getCutoffConstraint(vals, inds, len, rhs);

  std::vector<HighsInt> perm;
  perm.resize(nbin);
  std::iota(perm.begin(), perm.end(), 0);

  auto binaryend = std::partition(perm.begin(), perm.end(), [&](HighsInt pos) {
    return vals[pos] != 0.0 && !globaldom.isFixed(inds[pos]);
  });

  nbin = binaryend - perm.begin();

  // only one binary means we do have no cliques
  if (nbin <= 1) return;

  std::vector<CliqueVar> clique;
  clique.reserve(nbin);

  pdqsort(perm.begin(), binaryend, [&](HighsInt p1, HighsInt p2) {
    return std::make_pair(std::fabs(vals[p1]), p1) >
           std::make_pair(std::fabs(vals[p2]), p2);
  });

  // check if any cliques exists
  HighsCDouble minact;
  HighsInt ninf;
  globaldom.computeMinActivity(0, len, inds, vals, ninf, minact);
  const double feastol = mipsolver.mipdata_->feastol;
  if (std::fabs(vals[perm[0]]) + std::fabs(vals[perm[1]]) <=
      double(rhs - minact + feastol))
    return;

  for (HighsInt k = nbin - 1; k != 0; --k) {
    double mincliqueval =
        double(rhs - minact - std::fabs(vals[perm[k]]) + feastol);
    auto cliqueend = std::partition_point(
        perm.begin(), perm.begin() + k,
        [&](HighsInt p) { return std::abs(vals[p]) > mincliqueval; });

    // no clique for this variable
    if (cliqueend == perm.begin()) continue;

    clique.clear();

    for (auto j = perm.begin(); j != cliqueend; ++j) {
      HighsInt pos = *j;
      if (vals[pos] < 0)
        clique.emplace_back(inds[pos], 0);
      else
        clique.emplace_back(inds[pos], 1);
    }

    if (vals[perm[k]] < 0)
      clique.emplace_back(inds[perm[k]], 0);
    else
      clique.emplace_back(inds[perm[k]], 1);

    // printf("extracted this clique from obj:\n");
    // printClique(clique);
    if (clique.size() >= 2) {
      // printf("extracted clique from obj\n");
      // if (clique.size() > 2) runCliqueSubsumption(globaldom, clique);

      addClique(mipsolver, clique.data(), clique.size());
      if (globaldom.infeasible()) return;
    }

    // further cliques are just subsets of this clique
    if (cliqueend == perm.begin() + k) return;
  }
}